

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_paths.cpp
# Opt level: O0

void __thiscall
ExchangePaths_RoundTripForTwoPaths_Test::TestBody(ExchangePaths_RoundTripForTwoPaths_Test *this)

{
  UnorderedElementsAreMatcher<std::tuple<const_char_*,_const_char_*>_> matcher;
  bool bVar1;
  uint generation;
  iterator first;
  iterator last;
  string *psVar2;
  parser<pstore::exchange::import_ns::callbacks> *this_00;
  Message *pMVar3;
  error_code *this_01;
  char *pcVar4;
  const_reference ptVar5;
  database *this_02;
  string_mapping *string_table;
  insert_iterator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>_>
  out_00;
  error_code eVar6;
  _Head_base<0UL,_const_char_*,_false> in_stack_fffffffffffff928;
  AssertHelper local_570;
  Message local_568;
  error local_55c;
  error_or<pstore::typed_address<pstore::indirect_string>_> local_558;
  undefined1 local_540 [8];
  AssertionResult gtest_ar_4;
  Message local_528;
  testing local_520 [8];
  _Tuple_impl<1UL,_const_char_*> _Stack_518;
  char local_510 [16];
  undefined1 local_500 [8];
  AssertionResult gtest_ar_3;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_4e8;
  typed_address<pstore::indirect_string> local_4e0;
  raw_sstring_view local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  undefined1 local_4a8 [8];
  shared_sstring_view owner_1;
  Message local_488;
  error_code local_480;
  error_code local_470;
  undefined1 local_460 [8];
  AssertionResult gtest_ar_2;
  error_or<pstore::typed_address<pstore::indirect_string>_> str_addr_or_err_1;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_430;
  typed_address<pstore::indirect_string> local_428;
  raw_sstring_view local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  undefined1 local_3f0 [8];
  shared_sstring_view owner;
  Message local_3d0;
  error_code local_3c8;
  error_code local_3b8;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_1;
  error_or<pstore::typed_address<pstore::indirect_string>_> str_addr_or_err;
  Message local_378;
  uint local_36c;
  size_t local_368;
  undefined1 local_360 [8];
  AssertionResult gtest_ar;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  out;
  string local_330;
  AssertHelper local_310;
  char local_305;
  coord local_304;
  char local_2f9;
  string local_2f8;
  Message local_2d8;
  bool local_2c9;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_;
  parser<pstore::exchange::import_ns::callbacks> name_parser;
  undefined1 local_200 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction;
  undefined1 local_1c0 [7];
  mock_mutex mutex;
  string_mapping imported_names;
  string local_138;
  indent local_118 [2];
  undefined1 local_110 [8];
  string_mapping exported_names;
  undefined1 local_b0 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
  indir_strings;
  array<const_char_*,_2UL> paths;
  undefined1 local_60 [8];
  ostringstream exported_names_stream;
  ExchangePaths_RoundTripForTwoPaths_Test *this_local;
  
  exported_names_stream.str_.field_2._8_8_ = this;
  pstore::exchange::export_ns::ostringstream::ostringstream((ostringstream *)local_60);
  indir_strings._M_h._M_single_bucket = (__node_base_ptr)anon_var_dwarf_2c3a0e;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
                   *)local_b0);
  first = std::begin<std::array<char_const*,2ul>>
                    ((array<const_char_*,_2UL> *)&indir_strings._M_h._M_single_bucket);
  last = std::end<std::array<char_const*,2ul>>
                   ((array<const_char_*,_2UL> *)&indir_strings._M_h._M_single_bucket);
  exported_names.strings_._M_h._M_single_bucket =
       (__node_base_ptr)
       std::
       end<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>
                 ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
                   *)local_b0);
  out_00 = std::
           inserter<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>
                     ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
                       *)local_b0,(iterator)exported_names.strings_._M_h._M_single_bucket);
  add_export_strings<(pstore::trailer::indices)4,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>>
            (&(this->super_ExchangePaths).export_db_,first,last,out_00);
  pstore::exchange::export_ns::path_index_tag();
  pstore::exchange::export_ns::string_mapping::string_mapping<(pstore::trailer::indices)4>
            ((string_mapping *)local_110,&(this->super_ExchangePaths).export_db_);
  local_118[0].distance_ = 0;
  pstore::exchange::export_ns::indent::indent(local_118);
  this_02 = &(this->super_ExchangePaths).export_db_;
  generation = pstore::database::get_current_revision(this_02);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_138,"",
             (allocator *)((long)&imported_names.lookup_._M_h._M_single_bucket + 7));
  string_table = (string_mapping *)local_110;
  pstore::exchange::export_ns::emit_strings<(pstore::trailer::indices)4>
            ((ostream_base *)local_60,local_118[0],this_02,generation,&local_138,string_table,false)
  ;
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&imported_names.lookup_._M_h._M_single_bucket + 7));
  pstore::exchange::export_ns::string_mapping::~string_mapping((string_mapping *)local_110);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
                    *)local_b0);
  pstore::exchange::import_ns::string_mapping::string_mapping((string_mapping *)local_1c0);
  std::unique_lock<mock_mutex>::unique_lock
            ((unique_lock<mock_mutex> *)&name_parser.coordinate_,
             (mutex_type *)&transaction.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_200,
          &(this->super_ExchangePaths).import_db_,
          (unique_lock<mock_mutex> *)&name_parser.coordinate_);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&name_parser.coordinate_);
  anon_unknown.dwarf_2b80ee::import_strings_parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_,
             (transaction *)local_200,(string_mapping *)local_1c0);
  psVar2 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_((ostringstream *)local_60);
  this_00 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                      ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_,psVar2)
  ;
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(this_00);
  local_2c9 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error
                        ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
  local_2c9 = !local_2c9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2c8,&local_2c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pMVar3 = testing::Message::operator<<(&local_2d8,(char (*) [17])"JSON error was: ");
    this_01 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error
                        ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
    std::error_code::message_abi_cxx11_(&local_2f8,this_01);
    pMVar3 = testing::Message::operator<<(pMVar3,&local_2f8);
    local_2f9 = ' ';
    pMVar3 = testing::Message::operator<<(pMVar3,&local_2f9);
    local_304 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::coordinate
                          ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
    pMVar3 = testing::Message::operator<<(pMVar3,&local_304);
    local_305 = '\n';
    pMVar3 = testing::Message::operator<<(pMVar3,&local_305);
    psVar2 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_((ostringstream *)local_60);
    pMVar3 = testing::Message::operator<<(pMVar3,psVar2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_330,(internal *)local_2c8,(AssertionResult *)"name_parser.has_error ()","true"
               ,"false",(char *)string_table);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
               ,0x96,pcVar4);
    testing::internal::AssertHelper::operator=(&local_310,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_2f8);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
  if (bVar1) {
    pstore::transaction_base::commit((transaction_base *)local_200);
  }
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_200);
  if (bVar1) {
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&gtest_ar.message_);
    local_368 = pstore::exchange::import_ns::string_mapping::size((string_mapping *)local_1c0);
    local_36c = 2;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_360,"imported_names.size ()","2U",&local_368,&local_36c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
    if (!bVar1) {
      testing::Message::Message(&local_378);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&str_addr_or_err.has_error_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
                 ,0xa0,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&str_addr_or_err.has_error_,&local_378);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&str_addr_or_err.has_error_);
      testing::Message::~Message(&local_378);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
    if (bVar1) {
      pstore::exchange::import_ns::string_mapping::lookup
                ((error_or<pstore::typed_address<pstore::indirect_string>_> *)&gtest_ar_1.message_,
                 (string_mapping *)local_1c0,0);
      eVar6 = pstore::error_or<pstore::typed_address<pstore::indirect_string>_>::get_error
                        ((error_or<pstore::typed_address<pstore::indirect_string>_> *)
                         &gtest_ar_1.message_);
      local_3b8._M_cat = eVar6._M_cat;
      local_3b8._M_value = eVar6._M_value;
      std::error_code::error_code(&local_3c8);
      testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
                ((EqHelper *)local_3a8,"str_addr_or_err.get_error ()","std::error_code{}",&local_3b8
                 ,&local_3c8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
      if (!bVar1) {
        testing::Message::Message(&local_3d0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&owner.size_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
                   ,0xa4,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&owner.size_,&local_3d0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&owner.size_);
        testing::Message::~Message(&local_3d0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
      if (bVar1) {
        pstore::sstring_view<std::shared_ptr<const_char>_>::sstring_view
                  ((sstring_view<std::shared_ptr<const_char>_> *)local_3f0);
        ptVar5 = pstore::error_or<pstore::typed_address<pstore::indirect_string>_>::operator*
                           ((error_or<pstore::typed_address<pstore::indirect_string>_> *)
                            &gtest_ar_1.message_);
        local_428.a_.a_ = (address)(ptVar5->a_).a_;
        pstore::gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::not_null
                  (&local_430,(sstring_view<std::shared_ptr<const_char>_> *)local_3f0);
        local_420 = pstore::get_sstring_view
                              (&(this->super_ExchangePaths).import_db_,local_428,local_430);
        std::allocator<char>::allocator();
        pstore::sstring_view<char_const*>::to_string<std::allocator<char>>
                  (&local_410,(sstring_view<char_const*> *)&local_420,
                   (allocator<char> *)&str_addr_or_err_1.field_0x17);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar.message_,&local_410);
        std::__cxx11::string::~string((string *)&local_410);
        std::allocator<char>::~allocator((allocator<char> *)&str_addr_or_err_1.field_0x17);
        pstore::sstring_view<std::shared_ptr<const_char>_>::~sstring_view
                  ((sstring_view<std::shared_ptr<const_char>_> *)local_3f0);
      }
      pstore::error_or<pstore::typed_address<pstore::indirect_string>_>::~error_or
                ((error_or<pstore::typed_address<pstore::indirect_string>_> *)&gtest_ar_1.message_);
      if (bVar1) {
        pstore::exchange::import_ns::string_mapping::lookup
                  ((error_or<pstore::typed_address<pstore::indirect_string>_> *)&gtest_ar_2.message_
                   ,(string_mapping *)local_1c0,1);
        eVar6 = pstore::error_or<pstore::typed_address<pstore::indirect_string>_>::get_error
                          ((error_or<pstore::typed_address<pstore::indirect_string>_> *)
                           &gtest_ar_2.message_);
        local_470._M_cat = eVar6._M_cat;
        local_470._M_value = eVar6._M_value;
        std::error_code::error_code(&local_480);
        testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
                  ((EqHelper *)local_460,"str_addr_or_err.get_error ()","std::error_code{}",
                   &local_470,&local_480);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
        if (!bVar1) {
          testing::Message::Message(&local_488);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_460);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&owner_1.size_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
                     ,0xaa,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&owner_1.size_,&local_488);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&owner_1.size_);
          testing::Message::~Message(&local_488);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
        if (bVar1) {
          pstore::sstring_view<std::shared_ptr<const_char>_>::sstring_view
                    ((sstring_view<std::shared_ptr<const_char>_> *)local_4a8);
          ptVar5 = pstore::error_or<pstore::typed_address<pstore::indirect_string>_>::operator*
                             ((error_or<pstore::typed_address<pstore::indirect_string>_> *)
                              &gtest_ar_2.message_);
          local_4e0.a_.a_ = (address)(ptVar5->a_).a_;
          pstore::gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::not_null
                    (&local_4e8,(sstring_view<std::shared_ptr<const_char>_> *)local_4a8);
          local_4d8 = pstore::get_sstring_view
                                (&(this->super_ExchangePaths).import_db_,local_4e0,local_4e8);
          std::allocator<char>::allocator();
          pstore::sstring_view<char_const*>::to_string<std::allocator<char>>
                    (&local_4c8,(sstring_view<char_const*> *)&local_4d8,
                     (allocator<char> *)
                     ((long)&gtest_ar_3.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 7));
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_ar.message_,&local_4c8);
          std::__cxx11::string::~string((string *)&local_4c8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&gtest_ar_3.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 7));
          pstore::sstring_view<std::shared_ptr<const_char>_>::~sstring_view
                    ((sstring_view<std::shared_ptr<const_char>_> *)local_4a8);
        }
        pstore::error_or<pstore::typed_address<pstore::indirect_string>_>::~error_or
                  ((error_or<pstore::typed_address<pstore::indirect_string>_> *)&gtest_ar_2.message_
                  );
        if (bVar1) {
          testing::UnorderedElementsAre<char[6],char[6]>
                    (local_520,(char (*) [6])"path1",(char (*) [6])"path2");
          matcher.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*>.
          super__Head_base<0UL,_const_char_*,_false>._M_head_impl =
               in_stack_fffffffffffff928._M_head_impl;
          matcher.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*>.
          super__Tuple_impl<1UL,_const_char_*>.super__Head_base<1UL,_const_char_*,_false>.
          _M_head_impl = _Stack_518.super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
          testing::internal::
          MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<char_const*,char_const*>>>
                    (matcher);
          testing::internal::
          PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<char_const*,char_const*>>>
          ::operator()(local_500,local_510,
                       (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x30007b);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
          if (!bVar1) {
            testing::Message::Message(&local_528);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
                       ,0xaf,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_4.message_,&local_528);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
            testing::Message::~Message(&local_528);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
          pstore::exchange::import_ns::string_mapping::lookup
                    (&local_558,(string_mapping *)local_1c0,2);
          local_55c = no_such_name;
          testing::internal::EqHelper::
          Compare<pstore::error_or<pstore::typed_address<pstore::indirect_string>_>,_pstore::exchange::import_ns::error,_nullptr>
                    ((EqHelper *)local_540,"imported_names.lookup (2U)",
                     "pstore::exchange::import_ns::error::no_such_name",&local_558,&local_55c);
          pstore::error_or<pstore::typed_address<pstore::indirect_string>_>::~error_or(&local_558);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
          if (!bVar1) {
            testing::Message::Message(&local_568);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_540);
            testing::internal::AssertHelper::AssertHelper
                      (&local_570,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
                       ,0xb0,pcVar4);
            testing::internal::AssertHelper::operator=(&local_570,&local_568);
            testing::internal::AssertHelper::~AssertHelper(&local_570);
            testing::Message::~Message(&local_568);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
        }
      }
    }
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar.message_);
  }
  pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)local_1c0);
  pstore::exchange::export_ns::ostringstream::~ostringstream((ostringstream *)local_60);
  return;
}

Assistant:

TEST_F (ExchangePaths, RoundTripForTwoPaths) {
    // The output from the export phase.
    static constexpr auto comments = false;
    pstore::exchange::export_ns::ostringstream exported_names_stream;

    // The export phase. We put two strings into the paths index and export it.
    {
        std::array<pstore::gsl::czstring, 2> paths{{"path1", "path2"}};
        std::unordered_map<std::string, pstore::typed_address<pstore::indirect_string>>
            indir_strings;
        add_export_strings<pstore::trailer::indices::path> (
            export_db_, std::begin (paths), std::end (paths),
            std::inserter (indir_strings, std::end (indir_strings)));

        // Write the paths that we just created as JSON.
        pstore::exchange::export_ns::string_mapping exported_names{
            export_db_, pstore::exchange::export_ns::path_index_tag ()};
        pstore::exchange::export_ns::emit_strings<pstore::trailer::indices::path> (
            exported_names_stream, pstore::exchange::export_ns::indent{}, export_db_,
            export_db_.get_current_revision (), "", &exported_names, comments);
    }

    // The output from the import phase: the mapping from path index to address.
    pstore::exchange::import_ns::string_mapping imported_names;

    // The import phase. Read the JSON produced by the export phase and populate a database
    // accordingly.
    {
        mock_mutex mutex;
        auto transaction = begin (import_db_, transaction_lock{mutex});
        {
            auto name_parser = import_strings_parser (&transaction, &imported_names);
            name_parser.input (exported_names_stream.str ()).eof ();
            ASSERT_FALSE (name_parser.has_error ())
                << "JSON error was: " << name_parser.last_error ().message () << ' '
                << name_parser.coordinate () << '\n'
                << exported_names_stream.str ();
        }
        transaction.commit ();
    }

    // Now verify the result of the import phase.
    std::list<std::string> out;
    ASSERT_EQ (imported_names.size (), 2U);

    {
        auto const str_addr_or_err = imported_names.lookup (0U);
        ASSERT_EQ (str_addr_or_err.get_error (), std::error_code{});
        pstore::shared_sstring_view owner;
        out.push_back (get_sstring_view (import_db_, *str_addr_or_err, &owner).to_string ());
    }
    {
        auto const str_addr_or_err = imported_names.lookup (1U);
        ASSERT_EQ (str_addr_or_err.get_error (), std::error_code{});
        pstore::shared_sstring_view owner;
        out.push_back (get_sstring_view (import_db_, *str_addr_or_err, &owner).to_string ());
    }

    EXPECT_THAT (out, testing::UnorderedElementsAre ("path1", "path2"));
    EXPECT_EQ (imported_names.lookup (2U), pstore::exchange::import_ns::error::no_such_name);
}